

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

bool __thiscall imrt::Collimator::isActiveBeamAngle(Collimator *this,int x,int y,int angle)

{
  mapped_type *pmVar1;
  key_type_conflict local_24;
  
  pmVar1 = std::
           map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ::operator[](&this->angle_row_beam_active,&local_24);
  if (((pmVar1->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
       _M_impl.super__Vector_impl_data._M_start[x].first <= y) &&
     (pmVar1 = std::
               map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ::operator[](&this->angle_row_beam_active,&local_24),
     y <= (pmVar1->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
          _M_impl.super__Vector_impl_data._M_start[x].second)) {
    return true;
  }
  return false;
}

Assistant:

bool Collimator::isActiveBeamAngle(int x, int y, int angle) {
    if (angle_row_beam_active[angle][x].first <= y && angle_row_beam_active[angle][x].second >= y)
      return(true);
    return(false);
  }